

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.h
# Opt level: O0

set<covenant::Sym,_std::less<covenant::Sym>,_std::allocator<covenant::Sym>_> * __thiscall
covenant::CFG::computeGenerating(CFG *this)

{
  uint uVar1;
  bool bVar2;
  ulong uVar3;
  size_type sVar4;
  reference pvVar5;
  reference pvVar6;
  CFG *this_00;
  CFG *pCVar7;
  long in_RSI;
  set<covenant::Sym,_std::less<covenant::Sym>,_std::allocator<covenant::Sym>_> *in_RDI;
  uint si;
  bool allSatisfy;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> RHS;
  int r;
  uint ri;
  uint vv;
  bool change;
  set<covenant::Sym,_std::less<covenant::Sym>,_std::allocator<covenant::Sym>_> *GenSet;
  set<covenant::Sym,_std::less<covenant::Sym>,_std::allocator<covenant::Sym>_>
  *in_stack_ffffffffffffff70;
  Sym in_stack_ffffffffffffff80;
  uint in_stack_ffffffffffffff84;
  uint local_4c;
  uint in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> *in_stack_ffffffffffffffc0;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> local_38;
  int local_20;
  uint local_1c;
  uint local_18;
  byte local_12;
  undefined1 local_11;
  
  local_11 = 0;
  std::set<covenant::Sym,_std::less<covenant::Sym>,_std::allocator<covenant::Sym>_>::set
            ((set<covenant::Sym,_std::less<covenant::Sym>,_std::allocator<covenant::Sym>_> *)
             0x2209ee);
  local_12 = 1;
  while ((local_12 & 1) != 0) {
    local_12 = 0;
    for (local_18 = 0; uVar3 = (ulong)local_18,
        sVar4 = std::
                vector<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                ::size((vector<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                        *)(in_RSI + 0x40)), uVar3 < sVar4; local_18 = local_18 + 1) {
      local_1c = 0;
      while( true ) {
        uVar3 = (ulong)local_1c;
        pvVar5 = std::
                 vector<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                 ::operator[]((vector<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                               *)(in_RSI + 0x40),(ulong)local_18);
        sVar4 = std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>::size
                          (pvVar5);
        if (sVar4 <= uVar3) break;
        pvVar5 = std::
                 vector<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                 ::operator[]((vector<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                               *)(in_RSI + 0x40),(ulong)local_18);
        pvVar6 = std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>::
                 operator[](pvVar5,(ulong)local_1c);
        local_20 = pvVar6->rule;
        std::
        vector<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>,_std::allocator<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>_>
        ::operator[]((vector<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>,_std::allocator<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>_>
                      *)(in_RSI + 0x58),(long)local_20);
        std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                  (in_stack_ffffffffffffffc0,
                   (vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)
                   CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
        in_stack_ffffffffffffffb8 = CONCAT13(1,(int3)in_stack_ffffffffffffffb8);
        local_4c = 0;
        while( true ) {
          this_00 = (CFG *)(ulong)local_4c;
          pCVar7 = (CFG *)std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::size
                                    (&local_38);
          uVar1 = in_stack_ffffffffffffff84 & 0xffffff;
          if (this_00 < pCVar7) {
            uVar1 = CONCAT13((char)(in_stack_ffffffffffffffb8 >> 0x18),
                             (int3)in_stack_ffffffffffffff84);
          }
          in_stack_ffffffffffffff84 = uVar1;
          if ((in_stack_ffffffffffffff84 & 0x1000000) == 0) break;
          std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::operator[]
                    (&local_38,(ulong)local_4c);
          bVar2 = Sym::isTerm((Sym *)0x220b30);
          if (!bVar2) {
            std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::operator[]
                      (&local_38,(ulong)local_4c);
            in_stack_ffffffffffffff70 =
                 (set<covenant::Sym,_std::less<covenant::Sym>,_std::allocator<covenant::Sym>_> *)
                 std::set<covenant::Sym,_std::less<covenant::Sym>,_std::allocator<covenant::Sym>_>::
                 count((set<covenant::Sym,_std::less<covenant::Sym>,_std::allocator<covenant::Sym>_>
                        *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80.x),
                       (key_type *)this_00);
            if (in_stack_ffffffffffffff70 ==
                (set<covenant::Sym,_std::less<covenant::Sym>,_std::allocator<covenant::Sym>_> *)0x0)
            {
              in_stack_ffffffffffffffb8 = in_stack_ffffffffffffffb8 & 0xffffff;
            }
          }
          local_4c = local_4c + 1;
        }
        if ((in_stack_ffffffffffffffb8 & 0x1000000) != 0) {
          Sym::mkVar(local_18);
          bVar2 = InsertAndNotifyChange(this_00,in_stack_ffffffffffffff70,in_stack_ffffffffffffff80)
          ;
          local_12 = (local_12 & 1) != 0 || bVar2;
        }
        std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::~vector
                  ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)
                   CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80.x));
        local_1c = local_1c + 1;
      }
    }
  }
  return in_RDI;
}

Assistant:

set<Sym> computeGenerating()
    {
      set<Sym> GenSet;
      bool change=true;
      while (change)
      {
        change = false;
        for ( unsigned int vv = 0; vv < prods.size(); vv++ )
        {
          for ( unsigned int ri = 0; ri < prods[vv].size(); ri++ )
          {
            const int r = prods[vv][ri].rule;
            vector<Sym> RHS = rules[r];
            bool allSatisfy=true;
            for(unsigned si =0; (si < RHS.size() && allSatisfy) ; si++)
            {
              if (!(RHS[si].isTerm() || GenSet.count(RHS[si]) > 0))
                allSatisfy=false;
            }
            if (allSatisfy)
              change |= InsertAndNotifyChange(GenSet,Sym::mkVar(vv));
          }
        }
      }
      return GenSet;
    }